

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O1

void __thiscall sentencepiece::ModelProto::ModelProto(ModelProto *this,Arena *arena)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelProto_00382380;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->pieces_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->pieces_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  if (scc_info_ModelProto_sentencepiece_5fmodel_2eproto.base.visit_status.super___atomic_base<int>.
      _M_i != 0) {
    google::protobuf::internal::InitSCCImpl(&scc_info_ModelProto_sentencepiece_5fmodel_2eproto.base)
    ;
  }
  this->self_test_data_ = (SelfTestData *)0x0;
  this->denormalizer_spec_ = (NormalizerSpec *)0x0;
  this->trainer_spec_ = (TrainerSpec *)0x0;
  this->normalizer_spec_ = (NormalizerSpec *)0x0;
  return;
}

Assistant:

ModelProto::ModelProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  pieces_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.ModelProto)
}